

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

void Au_ManCountThings(Au_Man_t *p)

{
  int iVar1;
  int iVar2;
  Au_Ntk_t *pAVar3;
  Au_Obj_t *p_00;
  Au_Ntk_t *p_01;
  int local_30;
  int local_2c;
  int k;
  int i;
  Au_Obj_t *pBox;
  Au_Ntk_t *pBoxModel;
  Au_Ntk_t *pNtk;
  Au_Man_t *p_local;
  
  local_2c = Vec_PtrSize(&p->vNtks);
  do {
    local_2c = local_2c + -1;
    if (local_2c < 1) {
      pAVar3 = Au_ManNtkRoot(p);
      printf("Total nodes = %15.0f. Total instances = %15.0f. Total ports = %15.0f.\n",
             pAVar3->nNodes,pAVar3->nBoxes,pAVar3->nPorts);
      printf("Total ANDs  = %15.0f.\n",pAVar3->nNodeAnds);
      printf("Total XORs  = %15.0f.\n",pAVar3->nNodeXors);
      printf("Total MUXes = %15.0f.\n",pAVar3->nNodeMuxs);
      return;
    }
    pAVar3 = Au_ManNtk(p,local_2c);
    iVar1 = Au_NtkBoxNum(pAVar3);
    pAVar3->nBoxes = (double)iVar1;
    iVar1 = Au_NtkNodeNum(pAVar3);
    pAVar3->nNodes = (double)iVar1;
    iVar1 = Au_NtkPiNum(pAVar3);
    iVar2 = Au_NtkPoNum(pAVar3);
    pAVar3->nPorts = (double)(iVar1 + iVar2);
    iVar1 = Au_NtkNodeNumFunc(pAVar3,1);
    pAVar3->nNodeAnds = (double)iVar1;
    iVar1 = Au_NtkNodeNumFunc(pAVar3,2);
    pAVar3->nNodeXors = (double)iVar1;
    iVar1 = Au_NtkNodeNumFunc(pAVar3,3);
    pAVar3->nNodeMuxs = (double)iVar1;
    for (local_30 = 0; iVar1 = Vec_IntSize(&pAVar3->vObjs), local_30 < iVar1;
        local_30 = local_30 + 1) {
      p_00 = Au_NtkObjI(pAVar3,local_30);
      iVar1 = Au_ObjIsBox(p_00);
      if (((iVar1 != 0) && (p_01 = Au_ObjModel(p_00), p_01 != (Au_Ntk_t *)0x0)) && (p_01 != pAVar3))
      {
        iVar1 = Au_ObjFaninNum(p_00);
        iVar2 = Au_NtkPiNum(p_01);
        if (iVar1 != iVar2) {
          __assert_fail("Au_ObjFaninNum(pBox) == Au_NtkPiNum(pBoxModel)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcHieNew.c"
                        ,0x200,"void Au_ManCountThings(Au_Man_t *)");
        }
        iVar1 = Au_BoxFanoutNum(p_00);
        iVar2 = Au_NtkPoNum(p_01);
        if (iVar1 != iVar2) {
          __assert_fail("Au_BoxFanoutNum(pBox) == Au_NtkPoNum(pBoxModel)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcHieNew.c"
                        ,0x201,"void Au_ManCountThings(Au_Man_t *)");
        }
        if (p_01->Id <= pAVar3->Id) {
          __assert_fail("pBoxModel->Id > pNtk->Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcHieNew.c"
                        ,0x202,"void Au_ManCountThings(Au_Man_t *)");
        }
        if (p_01->nPorts <= 0.0) {
          __assert_fail("pBoxModel->nPorts > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcHieNew.c"
                        ,0x203,"void Au_ManCountThings(Au_Man_t *)");
        }
        pAVar3->nBoxes = p_01->nBoxes + pAVar3->nBoxes;
        pAVar3->nNodes = p_01->nNodes + pAVar3->nNodes;
        pAVar3->nPorts = p_01->nPorts + pAVar3->nPorts;
        pAVar3->nNodeAnds = p_01->nNodeAnds + pAVar3->nNodeAnds;
        pAVar3->nNodeXors = p_01->nNodeXors + pAVar3->nNodeXors;
        pAVar3->nNodeMuxs = p_01->nNodeMuxs + pAVar3->nNodeMuxs;
      }
    }
  } while( true );
}

Assistant:

void Au_ManCountThings( Au_Man_t * p )
{
    Au_Ntk_t * pNtk, * pBoxModel;
    Au_Obj_t * pBox;
    int i, k;//, clk = Abc_Clock();
    Au_ManForEachNtkReverse( p, pNtk, i )
    {
        pNtk->nBoxes = Au_NtkBoxNum(pNtk);
        pNtk->nNodes = Au_NtkNodeNum(pNtk);
        pNtk->nPorts = Au_NtkPiNum(pNtk) + Au_NtkPoNum(pNtk);
        pNtk->nNodeAnds = Au_NtkNodeNumFunc( pNtk, 1 );
        pNtk->nNodeXors = Au_NtkNodeNumFunc( pNtk, 2 );
        pNtk->nNodeMuxs = Au_NtkNodeNumFunc( pNtk, 3 );
//        assert( pNtk->nNodes == pNtk->nNodeAnds + pNtk->nNodeXors + pNtk->nNodeMuxs );
//        printf( "adding %.0f nodes of model %s\n", pNtk->nNodes, Au_NtkName(pNtk) );
        Au_NtkForEachBox( pNtk, pBox, k )
        {
            pBoxModel = Au_ObjModel(pBox);
            if ( pBoxModel == NULL || pBoxModel == pNtk )
                continue;
            assert( Au_ObjFaninNum(pBox) == Au_NtkPiNum(pBoxModel) );
            assert( Au_BoxFanoutNum(pBox) == Au_NtkPoNum(pBoxModel) );
            assert( pBoxModel->Id > pNtk->Id );
            assert( pBoxModel->nPorts > 0 );
            pNtk->nBoxes += pBoxModel->nBoxes;
            pNtk->nNodes += pBoxModel->nNodes;
            pNtk->nPorts += pBoxModel->nPorts;
            pNtk->nNodeAnds += pBoxModel->nNodeAnds;
            pNtk->nNodeXors += pBoxModel->nNodeXors;
            pNtk->nNodeMuxs += pBoxModel->nNodeMuxs;
//            printf( "    adding %.0f nodes of model %s\n", pBoxModel->nNodes, Au_NtkName(pBoxModel) );
        }
//        printf( "total %.0f nodes in model %s\n", pNtk->nNodes, Au_NtkName(pNtk) );
    }
    pNtk = Au_ManNtkRoot(p);
    printf( "Total nodes = %15.0f. Total instances = %15.0f. Total ports = %15.0f.\n", 
//    printf( "Total nodes = %.2e. Total instances = %.2e. Total ports = %.2e.\n", 
        pNtk->nNodes, pNtk->nBoxes, pNtk->nPorts );
//    printf( "Total ANDs  = %15.0f. Total XORs      = %15.0f. Total MUXes = %15.0f.\n", 
//    printf( "Total ANDs  = %.2e. Total XORs      = %.2e. Total MUXes = %.2e.  ", 
//        pNtk->nNodeAnds, pNtk->nNodeXors, pNtk->nNodeMuxs );
    printf( "Total ANDs  = %15.0f.\n", pNtk->nNodeAnds );
    printf( "Total XORs  = %15.0f.\n", pNtk->nNodeXors );
    printf( "Total MUXes = %15.0f.\n", pNtk->nNodeMuxs );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}